

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-loadavg.c
# Opt level: O3

int run_test_get_loadavg(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  char **ppcVar3;
  char **ppcVar4;
  undefined8 uVar5;
  size_t sVar6;
  uv_getaddrinfo_t *puVar7;
  undefined4 *puVar8;
  int *piVar9;
  long extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long extraout_RDX_02;
  size_t *psVar10;
  undefined8 *puVar11;
  int *piVar12;
  long lVar13;
  double avg [3];
  undefined1 auStack_288 [144];
  undefined8 uStack_1f8;
  char **ppcStack_1e8;
  char **ppcStack_1e0;
  char **ppcStack_1d8;
  undefined1 auStack_1d0 [144];
  undefined8 uStack_140;
  char **ppcStack_130;
  code *pcStack_128;
  undefined1 auStack_120 [160];
  char **ppcStack_80;
  char *pcStack_70;
  long lStack_68;
  long lStack_60;
  char *pcStack_58;
  char **ppcStack_50;
  char **ppcStack_48;
  undefined1 *puStack_38;
  double local_28;
  double dStack_20;
  double local_18;
  
  local_28 = -1.0;
  dStack_20 = -1.0;
  local_18 = -1.0;
  uv_loadavg(&local_28);
  if (local_28 < 0.0) {
    run_test_get_loadavg_cold_3();
LAB_0015b395:
    run_test_get_loadavg_cold_2();
  }
  else {
    if (dStack_20 < 0.0) goto LAB_0015b395;
    if (0.0 <= local_18) {
      return 0;
    }
  }
  run_test_get_loadavg_cold_1();
  ppcStack_48 = (char **)0x15b3a9;
  puStack_38 = (undefined1 *)&local_28;
  ppcVar3 = (char **)uv_get_free_memory();
  ppcStack_48 = (char **)0x15b3b1;
  ppcVar4 = (char **)uv_get_total_memory();
  ppcStack_48 = (char **)0x15b3b9;
  uVar5 = uv_get_constrained_memory();
  ppcStack_48 = (char **)0x15b3d0;
  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu\n",ppcVar3,ppcVar4,uVar5);
  if (ppcVar3 == (char **)0x0) {
    ppcStack_48 = (char **)0x15b3ee;
    run_test_get_memory_cold_3();
LAB_0015b3ee:
    ppcStack_48 = (char **)0x15b3f3;
    run_test_get_memory_cold_2();
  }
  else {
    if (ppcVar4 == (char **)0x0) goto LAB_0015b3ee;
    if (ppcVar3 < ppcVar4) {
      return 0;
    }
  }
  ppcStack_48 = (char **)run_test_get_passwd;
  run_test_get_memory_cold_1();
  ppcStack_80 = (char **)0x15b407;
  ppcStack_48 = ppcVar3;
  iVar1 = uv_os_get_passwd(&pcStack_70);
  ppcVar4 = ppcStack_50;
  if (iVar1 == 0) {
    if (*pcStack_70 == '\0') goto LAB_0015b4cb;
    if (*pcStack_58 == '\0') goto LAB_0015b4d0;
    ppcStack_80 = (char **)0x15b438;
    sVar6 = strlen((char *)ppcStack_50);
    ppcVar3 = ppcVar4;
    if (sVar6 != 1) {
      if (sVar6 != 0) {
        if (*(char *)((long)ppcVar4 + (sVar6 - 1)) == '/') {
          ppcStack_80 = (char **)0x15b453;
          run_test_get_passwd_cold_13();
          goto LAB_0015b453;
        }
        goto LAB_0015b45c;
      }
      goto LAB_0015b502;
    }
LAB_0015b453:
    if (*(char *)ppcVar4 == '/') {
LAB_0015b45c:
      if (lStack_68 < 0) goto LAB_0015b4d5;
      if (lStack_60 < 0) goto LAB_0015b4da;
      ppcVar3 = &pcStack_70;
      ppcStack_80 = (char **)0x15b479;
      uv_os_free_passwd(ppcVar3);
      if (pcStack_70 != (char *)0x0) goto LAB_0015b4df;
      if (pcStack_58 != (char *)0x0) goto LAB_0015b4e4;
      if (ppcStack_50 != (char **)0x0) goto LAB_0015b4e9;
      ppcVar3 = &pcStack_70;
      ppcStack_80 = (char **)0x15b49c;
      uv_os_free_passwd(ppcVar3);
      if (pcStack_70 != (char *)0x0) goto LAB_0015b4ee;
      if (pcStack_58 != (char *)0x0) goto LAB_0015b4f3;
      if (ppcStack_50 != (char **)0x0) goto LAB_0015b4f8;
      ppcStack_80 = (char **)0x15b4b9;
      iVar1 = uv_os_get_passwd(0);
      if (iVar1 == -0x16) {
        return 0;
      }
      goto LAB_0015b4fd;
    }
  }
  else {
    ppcStack_80 = (char **)0x15b4cb;
    run_test_get_passwd_cold_1();
LAB_0015b4cb:
    ppcStack_80 = (char **)0x15b4d0;
    run_test_get_passwd_cold_15();
LAB_0015b4d0:
    ppcStack_80 = (char **)0x15b4d5;
    run_test_get_passwd_cold_14();
LAB_0015b4d5:
    ppcStack_80 = (char **)0x15b4da;
    run_test_get_passwd_cold_4();
LAB_0015b4da:
    ppcStack_80 = (char **)0x15b4df;
    run_test_get_passwd_cold_5();
LAB_0015b4df:
    ppcStack_80 = (char **)0x15b4e4;
    run_test_get_passwd_cold_6();
LAB_0015b4e4:
    ppcStack_80 = (char **)0x15b4e9;
    run_test_get_passwd_cold_7();
LAB_0015b4e9:
    ppcStack_80 = (char **)0x15b4ee;
    run_test_get_passwd_cold_8();
LAB_0015b4ee:
    ppcStack_80 = (char **)0x15b4f3;
    run_test_get_passwd_cold_9();
LAB_0015b4f3:
    ppcStack_80 = (char **)0x15b4f8;
    run_test_get_passwd_cold_10();
LAB_0015b4f8:
    ppcStack_80 = (char **)0x15b4fd;
    run_test_get_passwd_cold_11();
LAB_0015b4fd:
    ppcStack_80 = (char **)0x15b502;
    run_test_get_passwd_cold_12();
LAB_0015b502:
    ppcStack_80 = (char **)0x15b507;
    run_test_get_passwd_cold_3();
  }
  ppcStack_80 = (char **)run_test_getaddrinfo_fail;
  run_test_get_passwd_cold_2();
  iVar1 = (int)auStack_120;
  pcStack_128 = (code *)0x15b519;
  ppcStack_80 = ppcVar3;
  uVar5 = uv_default_loop();
  pcStack_128 = (code *)0x15b533;
  iVar2 = uv_getaddrinfo(uVar5,auStack_120,abort,0,0,0);
  if (iVar2 == -0x16) {
    pcStack_128 = (code *)0x15b541;
    uVar5 = uv_default_loop();
    pcStack_128 = (code *)0x15b560;
    iVar1 = (int)auStack_120;
    iVar2 = uv_getaddrinfo(uVar5,auStack_120,getaddrinfo_fail_cb,"xyzzy.xyzzy.xyzzy.",0,0);
    if (iVar2 != 0) goto LAB_0015b5c4;
    pcStack_128 = (code *)0x15b569;
    uVar5 = uv_default_loop();
    iVar1 = 0;
    pcStack_128 = (code *)0x15b573;
    iVar2 = uv_run(uVar5);
    if (iVar2 != 0) goto LAB_0015b5c9;
    if (fail_cb_called != 1) goto LAB_0015b5ce;
    pcStack_128 = (code *)0x15b585;
    ppcVar3 = (char **)uv_default_loop();
    pcStack_128 = (code *)0x15b599;
    uv_walk(ppcVar3,close_walk_cb,0);
    iVar1 = 0;
    pcStack_128 = (code *)0x15b5a3;
    uv_run(ppcVar3);
    pcStack_128 = (code *)0x15b5a8;
    uVar5 = uv_default_loop();
    pcStack_128 = (code *)0x15b5b0;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_128 = (code *)0x15b5c4;
    run_test_getaddrinfo_fail_cold_1();
LAB_0015b5c4:
    pcStack_128 = (code *)0x15b5c9;
    run_test_getaddrinfo_fail_cold_2();
LAB_0015b5c9:
    pcStack_128 = (code *)0x15b5ce;
    run_test_getaddrinfo_fail_cold_3();
LAB_0015b5ce:
    pcStack_128 = (code *)0x15b5d3;
    run_test_getaddrinfo_fail_cold_4();
  }
  pcStack_128 = getaddrinfo_fail_cb;
  run_test_getaddrinfo_fail_cold_5();
  if (fail_cb_called == 0) {
    if (-1 < iVar1) goto LAB_0015b5ff;
    if (extraout_RDX == 0) {
      ppcStack_130 = (char **)0x15b5f2;
      pcStack_128._0_4_ = extraout_EAX;
      uv_freeaddrinfo(0);
      fail_cb_called = fail_cb_called + 1;
      return (int)pcStack_128;
    }
  }
  else {
    ppcStack_130 = (char **)0x15b5ff;
    getaddrinfo_fail_cb_cold_1();
LAB_0015b5ff:
    ppcStack_130 = (char **)0x15b604;
    getaddrinfo_fail_cb_cold_2();
  }
  ppcStack_130 = (char **)run_test_getaddrinfo_fail_sync;
  getaddrinfo_fail_cb_cold_3();
  ppcStack_1d8 = (char **)0x15b616;
  ppcStack_130 = ppcVar3;
  uVar5 = uv_default_loop();
  ppcStack_1d8 = (char **)0x15b630;
  iVar1 = uv_getaddrinfo(uVar5,auStack_1d0,0,"xyzzy.xyzzy.xyzzy.",0,0);
  if (iVar1 < 0) {
    ppcStack_1d8 = (char **)0x15b641;
    uv_freeaddrinfo(uStack_140);
    ppcStack_1d8 = (char **)0x15b646;
    ppcVar3 = (char **)uv_default_loop();
    ppcStack_1d8 = (char **)0x15b65a;
    uv_walk(ppcVar3,close_walk_cb,0);
    ppcStack_1d8 = (char **)0x15b664;
    uv_run(ppcVar3,0);
    ppcStack_1d8 = (char **)0x15b669;
    uVar5 = uv_default_loop();
    ppcStack_1d8 = (char **)0x15b671;
    iVar1 = uv_loop_close(uVar5);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    ppcStack_1d8 = (char **)0x15b685;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  ppcStack_1d8 = (char **)run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  ppcStack_1e0 = (char **)0x15b695;
  ppcStack_1d8 = ppcVar3;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  ppcStack_1e0 = (char **)0x15b6a1;
  puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
  ppcStack_1e0 = (char **)0x15b6c4;
  iVar1 = uv_getaddrinfo(puVar7,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",0,0);
  if (iVar1 == 0) {
    ppcStack_1e0 = (char **)0x15b6cd;
    puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
    ppcStack_1e0 = (char **)0x15b6d7;
    uv_run(puVar7,0);
    if (getaddrinfo_cbs != 1) goto LAB_0015b71d;
    ppcStack_1e0 = (char **)0x15b6e5;
    ppcVar3 = (char **)uv_default_loop();
    ppcStack_1e0 = (char **)0x15b6f9;
    uv_walk(ppcVar3,close_walk_cb,0);
    ppcStack_1e0 = (char **)0x15b703;
    uv_run(ppcVar3,0);
    ppcStack_1e0 = (char **)0x15b708;
    puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
    ppcStack_1e0 = (char **)0x15b710;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    ppcStack_1e0 = (char **)0x15b71d;
    run_test_getaddrinfo_basic_cold_1();
LAB_0015b71d:
    ppcStack_1e0 = (char **)0x15b722;
    run_test_getaddrinfo_basic_cold_2();
  }
  ppcStack_1e0 = (char **)getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  ppcStack_1e0 = ppcVar3;
  if (getaddrinfo_handle == puVar7) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    ppcStack_1e8 = (char **)0x15b73f;
    free(puVar7);
    iVar1 = uv_freeaddrinfo(extraout_RDX_00);
    return iVar1;
  }
  ppcStack_1e8 = (char **)run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  ppcStack_1e8 = ppcVar3;
  uVar5 = uv_default_loop();
  iVar1 = uv_getaddrinfo(uVar5,auStack_288,0,"localhost",0,0);
  if (iVar1 == 0) {
    uv_freeaddrinfo(uStack_1f8);
    ppcVar3 = (char **)uv_default_loop();
    uv_walk(ppcVar3,close_walk_cb,0);
    uv_run(ppcVar3,0);
    uVar5 = uv_default_loop();
    iVar1 = uv_loop_close(uVar5);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  puVar7 = getaddrinfo_handles;
  piVar12 = callback_counts;
  lVar13 = 0;
  do {
    *piVar12 = 0;
    puVar11 = (undefined8 *)0x4;
    puVar8 = (undefined4 *)malloc(4);
    if (puVar8 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015b8bc:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_0015b8c1;
    }
    *puVar8 = (int)lVar13;
    puVar7->data = puVar8;
    puVar11 = (undefined8 *)uv_default_loop();
    iVar1 = uv_getaddrinfo(puVar11,puVar7,getaddrinfo_cuncurrent_cb,"localhost",0,0,ppcVar3);
    if (iVar1 != 0) goto LAB_0015b8bc;
    lVar13 = lVar13 + 1;
    puVar7 = puVar7 + 1;
    piVar12 = piVar12 + 1;
  } while (lVar13 != 10);
  puVar11 = (undefined8 *)uv_default_loop();
  lVar13 = 0;
  uv_run(puVar11,0);
  do {
    if (*(int *)((long)callback_counts + lVar13) != 1) goto LAB_0015b8c1;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0x28);
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  puVar11 = (undefined8 *)uv_default_loop();
  iVar1 = uv_loop_close();
  if (iVar1 == 0) {
    return 0;
  }
LAB_0015b8c6:
  run_test_getaddrinfo_concurrent_cold_3();
  piVar12 = (int *)*puVar11;
  piVar9 = callback_counts;
  psVar10 = &closedir_req.bufsml[1].len;
  lVar13 = 0;
  do {
    psVar10 = psVar10 + 0x14;
    if (psVar10 == puVar11) goto LAB_0015b903;
    piVar9 = piVar9 + 1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar13 = extraout_RDX_02;
LAB_0015b903:
  if (*piVar12 == (int)lVar13) {
    *piVar9 = *piVar9 + 1;
    free(piVar12);
    iVar1 = uv_freeaddrinfo(extraout_RDX_01);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return iVar1;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(piVar12,0);
  return iVar1;
LAB_0015b8c1:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0015b8c6;
}

Assistant:

TEST_IMPL(get_loadavg) {

  double avg[3] = {-1, -1, -1};
  uv_loadavg(avg);

  ASSERT(avg[0] >= 0);
  ASSERT(avg[1] >= 0);
  ASSERT(avg[2] >= 0);

  return 0;
}